

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  long lVar1;
  once_flag *__once;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Symbol SVar5;
  Descriptor *pDVar6;
  Symbol SVar7;
  long lVar8;
  FieldDescriptor *this_00;
  Symbol SVar9;
  long lVar10;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  long lVar4;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  lVar4 = CONCAT44(extraout_var,iVar3);
  SVar5 = LookupSymbolNoPlaceholder
                    (this->builder_,name,(string *)(*(long *)(lVar4 + 8) + 0x20),LOOKUP_ALL,true);
  SVar9.ptr_ = (SymbolBase *)(FieldDescriptor *)0x0;
  if ((SVar5.ptr_ != (SymbolBase *)0x0) &&
     (SVar9.ptr_ = (SymbolBase *)(FieldDescriptor *)0x0, (SVar5.ptr_)->symbol_type_ == '\x02')) {
    SVar9 = SVar5;
  }
  if ((FieldDescriptor *)SVar9.ptr_ == (FieldDescriptor *)0x0 && SVar5.ptr_ != (SymbolBase *)0x0) {
    if (((SVar5.ptr_)->symbol_type_ == '\x01') &&
       (*(char *)(*(long *)(lVar4 + 0x20) + 0x48) == '\x01')) {
      SVar7.ptr_ = (SymbolBase *)(Descriptor *)0x0;
      if ((SVar5.ptr_ != (SymbolBase *)0x0) && ((SVar5.ptr_)->symbol_type_ == '\x01')) {
        SVar7 = SVar5;
      }
      if (0 < *(int *)((Descriptor *)SVar7.ptr_ + 0x7c)) {
        lVar10 = 0;
        lVar8 = 0;
        do {
          lVar1 = *(long *)((Descriptor *)SVar7.ptr_ + 0x50);
          if (*(long *)(lVar1 + 0x20 + lVar10) == lVar4) {
            this_00 = (FieldDescriptor *)(lVar10 + lVar1);
            __once = *(once_flag **)(lVar1 + 0x18 + lVar10);
            if (__once != (once_flag *)0x0) {
              local_38 = FieldDescriptor::TypeOnceInit;
              local_40 = this_00;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (__once,&local_38,&local_40);
            }
            if (((*(char *)(lVar1 + 2 + lVar10) != '\v') ||
                ((*(byte *)(lVar1 + 1 + lVar10) & 0x60) != 0x20)) ||
               (pDVar6 = FieldDescriptor::message_type(this_00), pDVar6 != (Descriptor *)SVar7.ptr_)
               ) goto LAB_0036cf23;
            bVar2 = false;
          }
          else {
LAB_0036cf23:
            bVar2 = true;
            this_00 = (FieldDescriptor *)SVar9.ptr_;
          }
          if (!bVar2) {
            return this_00;
          }
          lVar8 = lVar8 + 1;
          lVar10 = lVar10 + 0x48;
          SVar9.ptr_ = (SymbolBase *)this_00;
        } while (lVar8 < *(int *)((Descriptor *)SVar7.ptr_ + 0x7c));
      }
    }
    SVar9.ptr_ = (SymbolBase *)0x0;
  }
  return (FieldDescriptor *)SVar9.ptr_;
}

Assistant:

const FieldDescriptor* FindExtension(Message* message,
                                       const std::string& name) const override {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result =
        builder_->LookupSymbolNoPlaceholder(name, descriptor->full_name());
    if (auto* field = result.field_descriptor()) {
      return field;
    } else if (result.type() == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor();
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return nullptr;
  }